

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentFromInitializerList<phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>_>
::TestBody(AssignmentFromInitializerList<phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>_>
           *this)

{
  Generator<phmap::priv::hash_internal::EnumClass,_void> *this_00;
  _Head_base<0UL,_unsigned_long,_false> *this_01;
  initializer_list<phmap::priv::hash_internal::EnumClass> iVar1;
  bool bVar2;
  char *message;
  size_type sVar3;
  node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  *s;
  initializer_list<phmap::priv::hash_internal::EnumClass> xs;
  AssertHelper local_1b0;
  Message local_1a8;
  vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  local_1a0;
  _Head_base<0UL,_unsigned_long,_false> *local_188;
  iterator pEStack_180;
  UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::EnumClass> local_170;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::EnumClass>_>
  local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  StatefulTestingEqual local_118 [3];
  StatefulTestingHash local_100;
  _Head_base<0UL,_unsigned_long,_false> *local_f8;
  iterator pEStack_f0;
  node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  local_e0;
  undefined1 local_98 [8];
  TypeParam m;
  initializer_list<phmap::priv::hash_internal::EnumClass> values;
  Generator<phmap::priv::hash_internal::EnumClass,_void> gen;
  AssignmentFromInitializerList<phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>_>
  *this_local;
  UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::EnumClass> *matcher;
  
  this_00 = (Generator<phmap::priv::hash_internal::EnumClass,_void> *)((long)&values._M_len + 7);
  m.
  super_raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()(this_00);
  hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()(this_00);
  hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()(this_00);
  hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()(this_00);
  hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()(this_00);
  this_01 = &m.
             super_raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
             .settings_.
             super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
             .super__Head_base<0UL,_unsigned_long,_false>;
  values._M_array = (iterator)0x5;
  node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::node_hash_set((node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
                   *)local_98);
  pEStack_f0 = values._M_array;
  local_100.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  local_f8 = this_01;
  StatefulTestingHash::StatefulTestingHash(&local_100);
  local_118[0].super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(local_118);
  Alloc<phmap::priv::hash_internal::EnumClass>::Alloc
            ((Alloc<phmap::priv::hash_internal::EnumClass> *)&gtest_ar.message_,0);
  iVar1._M_len = (size_type)pEStack_f0;
  iVar1._M_array = &local_f8->_M_head_impl;
  sVar3 = 0;
  node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::raw_hash_set(&local_e0,iVar1,0,&local_100,local_118,(allocator_type *)&gtest_ar.message_);
  node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::operator=((node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
               *)local_98,&local_e0);
  node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::~node_hash_set(&local_e0);
  Alloc<phmap::priv::hash_internal::EnumClass>::~Alloc
            ((Alloc<phmap::priv::hash_internal::EnumClass> *)&gtest_ar.message_);
  pEStack_180 = values._M_array;
  xs._M_len = sVar3;
  xs._M_array = values._M_array;
  local_188 = this_01;
  testing::UnorderedElementsAreArray<phmap::priv::hash_internal::EnumClass>
            (&local_170,(testing *)this_01,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::EnumClass>>
            (&local_150,(internal *)&local_170,matcher);
  keys<phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>>
            (&local_1a0,(priv *)local_98,s);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::EnumClass>>
  ::operator()(local_130,(char *)&local_150,
               (vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
                *)"keys(m)");
  std::
  vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  ::~vector(&local_1a0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::EnumClass>_>
  ::~PredicateFormatterFromMatcher(&local_150);
  testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::EnumClass>::
  ~UnorderedElementsAreArrayMatcher(&local_170);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(&local_1a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x1b7,message);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::~node_hash_set((node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
                    *)local_98);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentFromInitializerList) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m;
  m = values;
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAreArray(values));
}